

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# differentiable.cxx
# Opt level: O3

void __thiscall DifferentialEquation::prepareNextState(DifferentialEquation *this)

{
  bool bVar1;
  byte bVar2;
  code *pcVar3;
  ulong uVar4;
  long lVar5;
  
  uVar4 = (ulong)(uint)this->eqnTermAmount;
  if (0 < this->eqnTermAmount) {
    bVar2 = 1;
    lVar5 = 0;
    do {
      while ((bVar2 & 1) == 0) {
        lVar5 = lVar5 + 1;
        bVar2 = 0;
        bVar1 = false;
        if ((int)uVar4 <= lVar5) goto LAB_001267c2;
      }
      bVar2 = (**(code **)((long)((this->eqnIntegrators).
                                  super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar5]->
                                 super_StochasticProcess).super_Parametric._vptr_Parametric + 0x30))
                        ();
      uVar4 = (ulong)this->eqnTermAmount;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (long)uVar4);
    if (bVar2 == 0) {
      bVar1 = false;
      goto LAB_001267c2;
    }
  }
  pcVar3 = (code *)this->eqnMethodPtr;
  if (((ulong)pcVar3 & 1) != 0) {
    pcVar3 = *(code **)(pcVar3 + *(long *)((long)&(this->super_StochasticVariable).
                                                  super_StochasticProcess.super_Parametric.
                                                  _vptr_Parametric + *(long *)&this->field_0x158) +
                                 -1);
  }
  (*pcVar3)();
  bVar1 = true;
LAB_001267c2:
  (this->super_StochasticVariable).super_StochasticProcess.stochNextStateIsPrepared = bVar1;
  return;
}

Assistant:

void DifferentialEquation::prepareNextState()
{
	bool allStatesPrepared = true;
	for (int i=0; i<eqnTermAmount; ++i)
		allStatesPrepared = allStatesPrepared && (*eqnIntegrators[i]).isNextStatePrepared();
	
	if (allStatesPrepared) {
		(this->*eqnMethodPtr)();
		stochNextStateIsPrepared = true;
	}
	else
		stochNextStateIsPrepared = false;
}